

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O2

void anon_unknown.dwarf_1498d::SolverDpllTriadSimd<2>::InitClue(char *input,State *state,int pos)

{
  undefined1 auVar1 [32];
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  lVar2 = (long)pos * 6;
  auVar1 = vandnps_avx(*(undefined1 (*) [32])
                        ((anonymous_namespace)::tables +
                        (ulong)(byte)(anonymous_namespace)::tables[lVar2 + 0x1905] * 0x20 +
                        ((long)input[pos] + -0x31) * 0x200),
                       *(undefined1 (*) [32])
                        state->boxen[(byte)(anonymous_namespace)::tables[lVar2 + 0x1902]].cells.vec)
  ;
  *(undefined1 (*) [32])state->boxen[(byte)(anonymous_namespace)::tables[lVar2 + 0x1902]].cells.vec
       = auVar1;
  auVar3 = vpbroadcastw_avx512vl();
  auVar4 = vpternlogd_avx512vl(*(undefined1 (*) [16])
                                ((ulong)(byte)(anonymous_namespace)::tables[lVar2 + 0x1903] * 0x10 +
                                (ulong)(byte)(anonymous_namespace)::tables[lVar2 + 0x1901] * 0x40 +
                                0x10f420),auVar3,
                               *(undefined1 (*) [16])
                                state->bands[0][(byte)(anonymous_namespace)::tables[lVar2 + 0x1900]]
                                .eliminations.vec,0xea);
  *(undefined1 (*) [16])
   state->bands[0][(byte)(anonymous_namespace)::tables[lVar2 + 0x1900]].eliminations.vec = auVar4;
  auVar3 = vpternlogd_avx512vl(*(undefined1 (*) [16])
                                ((ulong)(byte)(anonymous_namespace)::tables[lVar2 + 0x1904] * 0x10 +
                                (ulong)(byte)(anonymous_namespace)::tables[lVar2 + 0x1900] * 0x40 +
                                0x10f420),auVar3,
                               *(undefined1 (*) [16])
                                (state->boxen
                                 [(ulong)(byte)(anonymous_namespace)::tables[lVar2 + 0x1901] - 3].
                                 cells.vec + 2),0xea);
  *(undefined1 (*) [16])
   (state->boxen[(ulong)(byte)(anonymous_namespace)::tables[lVar2 + 0x1901] - 3].cells.vec + 2) =
       auVar3;
  return;
}

Assistant:

static inline void InitClue(const char *input, State &state, int pos) {
        const BoxIndexing &indexing = tables.box_indexing[pos];
        char digit = input[pos];
        uint16_t candidate = 1u << (uint32_t) (digit - '1');
        // perform eliminations for the clue in its own box, but don't propagate. this is
        // not strictly necessary since band eliminations will constrain the puzzle, but it
        // turns out to be important for performance on invalid zero-solution puzzles.
        state.boxen[indexing.box].cells = state.boxen[indexing.box].cells.and_not(
                tables.cell_assignment_eliminations[digit - '1'][indexing.elem]);
        // merge band eliminations; we'll propagate after all clue are processed.
        state.bands[0][indexing.box_i].eliminations = Cells08::X_Y_and_Z_or(
                tables.peer_x_elem_to_config_mask[indexing.box_j][indexing.elem_i],
                Cells08::All(candidate),
                state.bands[0][indexing.box_i].eliminations);
        state.bands[1][indexing.box_j].eliminations = Cells08::X_Y_and_Z_or(
                tables.peer_x_elem_to_config_mask[indexing.box_i][indexing.elem_j],
                Cells08::All(candidate),
                state.bands[1][indexing.box_j].eliminations);
    }